

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O3

int Mio_LibraryReadGateNameMax(Mio_Library_t *pLib)

{
  int iVar1;
  size_t sVar2;
  Mio_Gate_t *pMVar3;
  int iVar4;
  
  pMVar3 = pLib->pGates;
  if (pMVar3 == (Mio_Gate_t *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      sVar2 = strlen(pMVar3->pName);
      iVar1 = (int)sVar2;
      if ((int)sVar2 < iVar4) {
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      pMVar3 = pMVar3->pNext;
    } while (pMVar3 != (Mio_Gate_t *)0x0);
  }
  return iVar4;
}

Assistant:

int Mio_LibraryReadGateNameMax( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    int LenMax = 0, LenCur;
    Mio_LibraryForEachGate( pLib, pGate )
    {
        LenCur = strlen( Mio_GateReadName(pGate) );
        if ( LenMax < LenCur )
            LenMax = LenCur;
    }
    return LenMax;
}